

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O2

cio_error cio_websocket_location_handler_init
                    (cio_websocket_location_handler *handler,char **subprotocols,
                    size_t num_subprotocols,cio_websocket_on_connect_t on_connect,
                    _func_void_cio_websocket_location_handler_ptr *location_handler_free)

{
  cio_error cVar1;
  
  if ((handler != (cio_websocket_location_handler *)0x0) &&
     (location_handler_free != (_func_void_cio_websocket_location_handler_ptr *)0x0)) {
    *(byte *)&handler->flags = *(byte *)&handler->flags & 0xf0;
    handler->chosen_subprotocol = -1;
    handler->subprotocols = subprotocols;
    handler->number_subprotocols = num_subprotocols;
    handler->sec_websocket_key[0] = '\0';
    handler->location_handler_free = location_handler_free;
    cio_http_location_handler_init(&handler->http_location);
    (handler->http_location).on_header_field_name = handle_field_name;
    (handler->http_location).on_header_field_value = handle_field_value;
    (handler->http_location).on_headers_complete = handle_headers_complete;
    (handler->http_location).free = free_resources;
    cVar1 = cio_websocket_server_init(&handler->websocket,on_connect,close_server_websocket);
    return cVar1;
  }
  return CIO_INVALID_ARGUMENT;
}

Assistant:

enum cio_error cio_websocket_location_handler_init(struct cio_websocket_location_handler *handler,
                                                   const char *subprotocols[],
                                                   size_t num_subprotocols,
                                                   cio_websocket_on_connect_t on_connect,
                                                   void (*location_handler_free)(struct cio_websocket_location_handler *))
{
	if (cio_unlikely((handler == NULL) || (location_handler_free == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	handler->flags.current_header_field = CIO_WS_HEADER_UNKNOWN;
	handler->flags.ws_version_ok = 0;
	handler->flags.subprotocol_requested = 0;
	handler->chosen_subprotocol = -1;
	handler->subprotocols = subprotocols;
	handler->number_subprotocols = num_subprotocols;
	handler->sec_websocket_key[0] = 0;
	handler->location_handler_free = location_handler_free;

	cio_http_location_handler_init(&handler->http_location);
	handler->http_location.on_header_field_name = handle_field_name;
	handler->http_location.on_header_field_value = handle_field_value;
	handler->http_location.on_headers_complete = handle_headers_complete;
	handler->http_location.free = free_resources;

	enum cio_error err = cio_websocket_server_init(&handler->websocket, on_connect, close_server_websocket);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}